

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  char *pcVar1;
  int iVar2;
  ExprList_item *pItem;
  int dequote_local;
  Token *pName_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  if (pList != (ExprList *)0x0) {
    iVar2 = pList->nExpr + -1;
    pcVar1 = sqlite3DbStrNDup(pParse->db,pName->z,(ulong)pName->n);
    pList->a[iVar2].zName = pcVar1;
    if (dequote != 0) {
      sqlite3Dequote(pList->a[iVar2].zName);
    }
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,pList->a[iVar2].zName,pName);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  Token *pName,           /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zName==0 );
    pItem->zName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote ) sqlite3Dequote(pItem->zName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)pItem->zName, pName);
    }
  }
}